

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void handle_blocking(int socket_descriptor)

{
  int iVar1;
  int yes;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt(socket_descriptor,1,2,local_4,4);
  if (iVar1 != -1) {
    return;
  }
  throw("Error reclaiming socket");
}

Assistant:

void handle_blocking(int socket_descriptor) {
	// Will be necessary when calling setsockopt to free busy sockets
	int yes = 1;

	// Reclaim blocked but unused sockets (from zombie processes)
	// clang-format off
	int return_code = setsockopt(
		socket_descriptor,
		SOL_SOCKET,
		SO_REUSEADDR,
		&yes,
		sizeof yes
	 );
	// clang-format on

	if (return_code == -1) {
		throw("Error reclaiming socket");
	}
}